

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O2

bool __thiscall
SGParser::TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>::
Advance(TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
        *this)

{
  bool bVar1;
  uint uVar2;
  
  LineOffsetPosTracker::AdvanceChar(this->Pos,this->Character);
  bVar1 = TokenizerBase::ByteReader::Advance(&this->Reader);
  uVar2 = 0;
  if (bVar1) {
    uVar2 = (uint)(byte)*((this->Reader).Tok)->pTail;
  }
  this->Character = uVar2;
  return bVar1;
}

Assistant:

bool Advance() {
        Pos.AdvanceChar(Character);
        Pos.AdvanceByte();
        const bool hasAdvanced = Reader.Advance();
        Character              = hasAdvanced ? Reader.GetByte() : 0u;
        return hasAdvanced;
    }